

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O2

int Fxch_DivRemove(Fxch_Man_t *pFxchMan,int fUpdate,int fSingleCube,int fBase)

{
  int i;
  int iVar1;
  float Addition;
  
  i = Hsh_VecManAdd(pFxchMan->pDivHash,pFxchMan->vCubeFree);
  if (i < pFxchMan->vDivWeights->nSize) {
    if (fSingleCube == 0) {
      Addition = (float)(1 - (fBase + pFxchMan->vCubeFree->nSize));
    }
    else {
      Addition = -1.0;
    }
    Vec_FltAddToEntry(pFxchMan->vDivWeights,i,Addition);
    if ((fUpdate != 0) && (pFxchMan->vDivPrio != (Vec_Que_t *)0x0)) {
      iVar1 = Vec_QueIsMember(pFxchMan->vDivPrio,i);
      if (iVar1 != 0) {
        Vec_QueUpdate(pFxchMan->vDivPrio,i);
      }
    }
    return i;
  }
  __assert_fail("iDiv < Vec_FltSize( pFxchMan->vDivWeights )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                ,0x12a,"int Fxch_DivRemove(Fxch_Man_t *, int, int, int)");
}

Assistant:

int Fxch_DivRemove( Fxch_Man_t* pFxchMan,
                    int fUpdate,
                    int fSingleCube,
                    int fBase )
{
    int iDiv = Hsh_VecManAdd( pFxchMan->pDivHash, pFxchMan->vCubeFree );

    assert( iDiv < Vec_FltSize( pFxchMan->vDivWeights ) );

    /* Decrement weight */
    if ( fSingleCube )
        Vec_FltAddToEntry( pFxchMan->vDivWeights, iDiv, -1 );
    else
        Vec_FltAddToEntry( pFxchMan->vDivWeights, iDiv, -( fBase + Vec_IntSize( pFxchMan->vCubeFree ) - 1 ) );

    if ( fUpdate )
        if ( pFxchMan->vDivPrio )
        {
            if ( Vec_QueIsMember( pFxchMan->vDivPrio, iDiv ) )
                Vec_QueUpdate( pFxchMan->vDivPrio, iDiv );
        }

    return iDiv;
}